

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>::
ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>
             *this,char code)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  int iVar1;
  ushort *puVar2;
  undefined7 in_register_00000031;
  double dVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_10;
  
  local_10.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  iVar1 = (int)CONCAT71(in_register_00000031,code);
  if (iVar1 == 0x6c) {
    iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
  }
  else {
    if (iVar1 != 0x73) {
      if (iVar1 != 0x6e) {
        local_28 = 0;
        uStack_20 = 0;
        local_10.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this_00->super_BinaryReaderBase,(CStringRef)0x139eee,&local_10);
        return 0.0;
      }
      dVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
      return dVar3;
    }
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    puVar2 = (ushort *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,2);
    iVar1 = (int)(short)(*puVar2 << 8 | *puVar2 >> 8);
  }
  return (double)iVar1;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}